

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::TestCaseTracking::SectionTracker::SectionTracker
          (SectionTracker *this,NameAndLocation *nameAndLocation,TrackerContext *ctx,
          ITracker *parent)

{
  pointer pcVar1;
  size_t sVar2;
  int iVar3;
  undefined4 extraout_var;
  
  (this->super_TrackerBase).super_ITracker._vptr_ITracker = (_func_int **)&PTR__ITracker_00225fe0;
  (this->super_TrackerBase).super_ITracker.m_nameAndLocation.name._M_dataplus._M_p =
       (pointer)&(this->super_TrackerBase).super_ITracker.m_nameAndLocation.name.field_2;
  pcVar1 = (nameAndLocation->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_TrackerBase).super_ITracker.m_nameAndLocation,pcVar1,
             pcVar1 + (nameAndLocation->name)._M_string_length);
  sVar2 = (nameAndLocation->location).line;
  (this->super_TrackerBase).super_ITracker.m_nameAndLocation.location.file =
       (nameAndLocation->location).file;
  (this->super_TrackerBase).super_ITracker.m_nameAndLocation.location.line = sVar2;
  (this->super_TrackerBase).m_ctx = ctx;
  (this->super_TrackerBase).m_parent = parent;
  (this->super_TrackerBase).m_children.
  super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_TrackerBase).m_children.
  super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->super_TrackerBase).m_children.
           super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->super_TrackerBase).m_children.
           super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->super_TrackerBase).super_ITracker._vptr_ITracker =
       (_func_int **)&PTR__SectionTracker_00226100;
  (this->m_filters).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_filters).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_filters).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  trim(&this->m_trimmed_name,&nameAndLocation->name);
  if (parent != (ITracker *)0x0) {
    while( true ) {
      iVar3 = (*parent->_vptr_ITracker[0xe])(parent);
      if ((char)iVar3 != '\0') break;
      iVar3 = (*parent->_vptr_ITracker[7])(parent);
      parent = (ITracker *)CONCAT44(extraout_var,iVar3);
    }
    addNextFilters(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&parent[1].m_nameAndLocation.location.line);
  }
  return;
}

Assistant:

SectionTracker::SectionTracker( NameAndLocation const& nameAndLocation, TrackerContext& ctx, ITracker* parent )
    :   TrackerBase( nameAndLocation, ctx, parent ),
        m_trimmed_name(trim(nameAndLocation.name))
    {
        if( parent ) {
            while( !parent->isSectionTracker() )
                parent = &parent->parent();

            SectionTracker& parentSection = static_cast<SectionTracker&>( *parent );
            addNextFilters( parentSection.m_filters );
        }
    }